

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDiag.cpp
# Opt level: O0

JsErrorCode JsDiagGetBreakpoints(JsValueRef *breakpoints)

{
  JsErrorCode JVar1;
  JsValueRef *local_10;
  JsValueRef *breakpoints_local;
  
  local_10 = breakpoints;
  JVar1 = ContextAPIWrapper_NoRecord<false,JsDiagGetBreakpoints::__0>
                    ((anon_class_8_1_96caa502)&local_10);
  return JVar1;
}

Assistant:

CHAKRA_API JsDiagGetBreakpoints(
    _Out_ JsValueRef *breakpoints)
{
#ifndef ENABLE_SCRIPT_DEBUGGING
    return JsErrorCategoryUsage;
#else
    return ContextAPIWrapper_NoRecord<false>([&](Js::ScriptContext* scriptContext) -> JsErrorCode {
        PARAM_NOT_NULL(breakpoints);
        *breakpoints = JS_INVALID_REFERENCE;

        JsrtContext* currentContext = JsrtContext::GetCurrent();
        JsrtRuntime* runtime = currentContext->GetRuntime();

        ThreadContextScope scope(runtime->GetThreadContext());

        if (!scope.IsValid())
        {
            return JsErrorWrongThread;
        }

        JsrtDebugManager* jsrtDebugManager = runtime->GetJsrtDebugManager();
        VALIDATE_IS_DEBUGGING(jsrtDebugManager);

        Js::JavascriptArray* bpsArray = currentContext->GetScriptContext()->GetLibrary()->CreateArray();

        for (Js::ScriptContext* currentScriptContext = runtime->GetThreadContext()->GetScriptContextList();
            currentScriptContext != nullptr && !currentScriptContext->IsClosed();
            currentScriptContext = currentScriptContext->next)
        {
            jsrtDebugManager->GetBreakpoints(&bpsArray, currentScriptContext);
        }

        *breakpoints = bpsArray;
        return JsNoError;
    });
#endif
}